

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O1

Token * __thiscall
wabt::WastLexer::GetNameEqNumToken
          (Token *__return_storage_ptr__,WastLexer *this,string_view name,TokenType token_type)

{
  char cVar1;
  byte *pbVar2;
  ReservedChars RVar3;
  size_t offset;
  size_t sVar4;
  long lVar5;
  byte *pbVar6;
  byte *pbVar7;
  uint uVar8;
  bool bVar9;
  
  offset = name._M_len;
  bVar9 = offset == 0;
  if (!bVar9) {
    pbVar2 = (byte *)this->cursor_;
    sVar4 = 0;
    bVar9 = false;
    pbVar6 = pbVar2;
    do {
      cVar1 = name._M_str[sVar4];
      uVar8 = 0xffffffff;
      pbVar7 = pbVar6;
      if (pbVar6 < this->buffer_end_) {
        pbVar7 = pbVar6 + 1;
        this->cursor_ = (char *)pbVar7;
        uVar8 = (uint)*pbVar6;
      }
      if (uVar8 != (int)cVar1) {
        this->cursor_ = (char *)pbVar2;
        break;
      }
      sVar4 = sVar4 + 1;
      bVar9 = offset == sVar4;
      pbVar6 = pbVar7;
    } while (!bVar9);
  }
  if (bVar9) {
    pbVar2 = (byte *)this->cursor_;
    bVar9 = false;
    lVar5 = 0;
    pbVar6 = pbVar2;
    do {
      uVar8 = 0xffffffff;
      pbVar7 = pbVar6;
      if (pbVar6 < this->buffer_end_) {
        pbVar7 = pbVar6 + 1;
        this->cursor_ = (char *)pbVar7;
        uVar8 = (uint)*pbVar6;
      }
      if (uVar8 != (int)":0x"[lVar5 + 1]) {
        this->cursor_ = (char *)pbVar2;
        break;
      }
      lVar5 = lVar5 + 1;
      bVar9 = lVar5 == 2;
      pbVar6 = pbVar7;
    } while (!bVar9);
    if (bVar9) {
      bVar9 = ReadHexNum(this);
    }
    else {
      bVar9 = ReadNum(this);
    }
    if ((bVar9 != false) && (RVar3 = ReadReservedChars(this), RVar3 == None)) {
      TextToken(__return_storage_ptr__,this,token_type,offset);
      return __return_storage_ptr__;
    }
  }
  GetKeywordToken(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::GetNameEqNumToken(std::string_view name,
                                   TokenType token_type) {
  if (MatchString(name)) {
    if (MatchString("0x")) {
      if (ReadHexNum() && NoTrailingReservedChars()) {
        return TextToken(token_type, name.size());
      }
    } else if (ReadNum() && NoTrailingReservedChars()) {
      return TextToken(token_type, name.size());
    }
  }
  return GetKeywordToken();
}